

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O1

char * icu_63::PropNameData::getName(char *nameGroup,int32_t nameIndex)

{
  size_t sVar1;
  char *pcVar2;
  char *__s;
  int iVar3;
  
  if (nameIndex < 0) {
    return (char *)0x0;
  }
  if (nameIndex < *nameGroup) {
    __s = nameGroup + 1;
    if (nameIndex != 0) {
      iVar3 = nameIndex + 1;
      do {
        sVar1 = strlen(__s);
        __s = __s + sVar1 + 1;
        iVar3 = iVar3 + -1;
      } while (1 < iVar3);
    }
    pcVar2 = (char *)0x0;
    if (*__s != '\0') {
      pcVar2 = __s;
    }
  }
  else {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

const char *PropNameData::getName(const char *nameGroup, int32_t nameIndex) {
    int32_t numNames=*nameGroup++;
    if(nameIndex<0 || numNames<=nameIndex) {
        return NULL;
    }
    // Skip nameIndex names.
    for(; nameIndex>0; --nameIndex) {
        nameGroup=uprv_strchr(nameGroup, 0)+1;
    }
    if(*nameGroup==0) {
        return NULL;  // no name (Property[Value]Aliases.txt has "n/a")
    }
    return nameGroup;
}